

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O2

int_mv get_ref_mv_for_mv_stats
                 (MB_MODE_INFO *mbmi,MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame,int ref_idx)

{
  byte bVar1;
  uint uVar2;
  int_mv *piVar3;
  char cVar4;
  long lVar5;
  
  cVar4 = mbmi->ref_frame[0];
  uVar2 = (*(ushort *)&mbmi->field_0xa7 >> 4 & 3) + (uint)((byte)(mbmi->mode - 0x15) < 2);
  bVar1 = mbmi->ref_frame[1];
  if ('\0' < (char)bVar1) {
    if (bVar1 < 5 || '\x04' < cVar4) {
      for (lVar5 = 0; lVar5 != 9; lVar5 = lVar5 + 1) {
        if ((cVar4 == (&comp_ref0_lut)[lVar5]) && (bVar1 == (&comp_ref1_lut)[lVar5])) {
          cVar4 = (char)lVar5 + '\x14';
          goto LAB_002aaf55;
        }
      }
    }
    cVar4 = bVar1 * '\x04' + cVar4 + -0xd;
LAB_002aaf55:
    if ('\0' < (char)bVar1) {
      piVar3 = &mbmi_ext_frame->ref_mv_stack[uVar2].comp_mv;
      if (ref_idx == 0) {
        piVar3 = &mbmi_ext_frame->ref_mv_stack[uVar2].this_mv;
      }
      goto LAB_002aaf86;
    }
  }
  piVar3 = mbmi_ext_frame->global_mvs + cVar4;
  if (uVar2 < mbmi_ext_frame->ref_mv_count) {
    piVar3 = &mbmi_ext_frame->ref_mv_stack[uVar2].this_mv;
  }
LAB_002aaf86:
  return (int_mv)(*piVar3).as_int;
}

Assistant:

static inline int_mv get_ref_mv_for_mv_stats(
    const MB_MODE_INFO *mbmi, const MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame,
    int ref_idx) {
  int ref_mv_idx = mbmi->ref_mv_idx;
  if (mbmi->mode == NEAR_NEWMV || mbmi->mode == NEW_NEARMV) {
    assert(has_second_ref(mbmi));
    ref_mv_idx += 1;
  }

  const MV_REFERENCE_FRAME *ref_frames = mbmi->ref_frame;
  const int8_t ref_frame_type = av1_ref_frame_type(ref_frames);
  const CANDIDATE_MV *curr_ref_mv_stack = mbmi_ext_frame->ref_mv_stack;

  if (ref_frames[1] > INTRA_FRAME) {
    assert(ref_idx == 0 || ref_idx == 1);
    return ref_idx ? curr_ref_mv_stack[ref_mv_idx].comp_mv
                   : curr_ref_mv_stack[ref_mv_idx].this_mv;
  }

  assert(ref_idx == 0);
  return ref_mv_idx < mbmi_ext_frame->ref_mv_count
             ? curr_ref_mv_stack[ref_mv_idx].this_mv
             : mbmi_ext_frame->global_mvs[ref_frame_type];
}